

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O2

MPP_RET h265e_set_extra_info(H265eCtx *ctx)

{
  H265eStream *s;
  RK_U32 RVar1;
  H265eExtraInfo *out;
  long lVar2;
  int iVar3;
  RK_U32 RVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  RK_U8 *dst;
  long lVar8;
  
  out = (H265eExtraInfo *)ctx->extra_info;
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_set_extra_info");
  }
  out->nal_num = 0;
  out->temporal_id = 0;
  s = &out->stream;
  h265e_stream_reset(s);
  h265e_nal_start(out,0x20,3);
  h265e_set_vps(ctx,&ctx->vps);
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_vps_write");
  }
  h265e_stream_realign(s);
  RVar1 = (out->stream).enc_stream.byte_cnt;
  h265e_stream_write_with_log(s,(ctx->vps).m_VPSId,4,"vps_video_parameter_set_id");
  h265e_stream_write_with_log(s,3,2,"vps_reserved_three_2bits");
  h265e_stream_write_with_log(s,0,6,"vps_reserved_zero_6bits");
  h265e_stream_write_with_log(s,(ctx->vps).m_maxTLayers - 1,3,"vps_max_sub_layers_minus1");
  h265e_stream_write1_with_log(s,(ctx->vps).m_bTemporalIdNestingFlag,"vps_temporal_id_nesting_flag")
  ;
  h265e_stream_write_with_log(s,0xffff,0x10,"vps_reserved_ffff_16bits");
  codePTL(s,&(ctx->vps).m_ptl,1,(ctx->vps).m_maxTLayers - 1);
  h265e_stream_write1_with_log(s,1,"vps_sub_layer_ordering_info_present_flag");
  for (uVar6 = 0; uVar6 <= (ctx->vps).m_maxTLayers - 1; uVar6 = uVar6 + 1) {
    h265e_stream_write_ue_with_log
              (s,(ctx->vps).m_maxDecPicBuffering[uVar6] - 1,"vps_max_dec_pic_buffering_minus1[i]");
    h265e_stream_write_ue_with_log(s,(ctx->vps).m_numReorderPics[uVar6],"vps_num_reorder_pics[i]");
    h265e_stream_write_ue_with_log
              (s,(ctx->vps).m_maxLatencyIncrease[uVar6],"vps_max_latency_increase_plus1[i]");
  }
  if (((ctx->vps).m_numHrdParameters < 2) ||
     (_mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "vps->m_numHrdParameters <= 1","h265e_vps_write",0x144),
     (mpp_debug._3_1_ & 0x10) == 0)) {
    uVar6 = 1;
    if ((ctx->vps).m_maxNuhReservedZeroLayerId == 0) {
      RVar4 = 0;
    }
    else {
      _mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "vps->m_maxNuhReservedZeroLayerId < 1","h265e_vps_write",0x145);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001c6435;
      RVar4 = (ctx->vps).m_maxNuhReservedZeroLayerId;
    }
    h265e_stream_write_with_log(s,RVar4,6,"vps_max_nuh_reserved_zero_layer_id");
    (ctx->vps).m_numOpSets = 1;
    h265e_stream_write_ue_with_log(s,0,"vps_max_op_sets_minus1");
    for (; uVar6 <= (ctx->vps).m_numOpSets - 1; uVar6 = uVar6 + 1) {
      for (uVar7 = 0; uVar7 <= (ctx->vps).m_maxNuhReservedZeroLayerId; uVar7 = uVar7 + 1) {
        (ctx->vps).m_layerIdIncludedFlag[(ulong)uVar6 + (ulong)uVar7][0] = 1;
        h265e_stream_write1_with_log(s,1,"layer_id_included_flag[opsIdx][i]");
      }
    }
    h265e_stream_write1_with_log
              (s,(ctx->vps).m_timingInfo.m_timingInfoPresentFlag,"vps_timing_info_present_flag");
    if ((ctx->vps).m_timingInfo.m_timingInfoPresentFlag != 0) {
      h265e_stream_write_with_log
                (s,(ctx->vps).m_timingInfo.m_numUnitsInTick,0x20,"vps_num_units_in_tick");
      h265e_stream_write_with_log(s,(ctx->vps).m_timingInfo.m_timeScale,0x20,"vps_time_scale");
      h265e_stream_write1_with_log
                (s,(ctx->vps).m_timingInfo.m_pocProportionalToTimingFlag,
                 "vps_poc_proportional_to_timing_flag");
      if ((ctx->vps).m_timingInfo.m_pocProportionalToTimingFlag != 0) {
        h265e_stream_write_ue_with_log
                  (s,(ctx->vps).m_timingInfo.m_numTicksPocDiffOneMinus1,
                   "vps_num_ticks_poc_diff_one_minus1");
      }
      (ctx->vps).m_numHrdParameters = 0;
      h265e_stream_write_ue_with_log(s,0,"vps_num_hrd_parameters");
    }
    h265e_stream_write1_with_log(s,0,"vps_extension_flag");
    h265e_stream_rbsp_trailing(s);
    h265e_stream_flush(s);
    if ((h265e_debug >> 9 & 1) != 0) {
      _mpp_log_l(4,"h265e_header_gen","write pure vps head size: %d bits",(char *)0x0,
                 (ulong)(((out->stream).enc_stream.byte_cnt - RVar1) * 8));
    }
    if ((h265e_debug & 1) != 0) {
      _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_vps_write");
    }
    h265e_nal_end(out);
    h265e_nal_start(out,0x21,3);
    h265e_set_sps(ctx,&ctx->sps,&ctx->vps);
    if ((h265e_debug & 1) != 0) {
      _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_sps_write");
    }
    h265e_stream_realign(s);
    RVar1 = (out->stream).enc_stream.byte_cnt;
    h265e_stream_write_with_log(s,(ctx->sps).m_VPSId,4,"sps_video_parameter_set_id");
    h265e_stream_write_with_log(s,(ctx->sps).m_maxTLayers - 1,3,"sps_max_sub_layers_minus1");
    h265e_stream_write1_with_log
              (s,(uint)((ctx->sps).m_bTemporalIdNestingFlag != 0),"sps_temporal_id_nesting_flag");
    codePTL(s,(ctx->sps).m_ptl,1,(ctx->sps).m_maxTLayers - 1);
    h265e_stream_write_ue_with_log(s,(ctx->sps).m_SPSId,"sps_seq_parameter_set_id");
    h265e_stream_write_ue_with_log(s,(ctx->sps).m_chromaFormatIdc,"chroma_format_idc");
    if ((ctx->sps).m_chromaFormatIdc == 4) {
      h265e_stream_write1_with_log(s,0,"separate_colour_plane_flag");
    }
    h265e_stream_write_ue_with_log(s,(ctx->sps).m_picWidthInLumaSamples,"pic_width_in_luma_samples")
    ;
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_picHeightInLumaSamples,"pic_height_in_luma_samples");
    h265e_stream_write1_with_log
              (s,(ctx->sps).m_conformanceWindow.m_enabledFlag,"conformance_window_flag");
    if ((ctx->sps).m_conformanceWindow.m_enabledFlag != 0) {
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_conformanceWindow.m_winLeftOffset /
                   (int)h264e_sps_to_packet::SubWidthC[(ctx->sps).m_chromaFormatIdc],
                 "conf_win_left_offset");
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_conformanceWindow.m_winRightOffset /
                   (int)h264e_sps_to_packet::SubWidthC[(ctx->sps).m_chromaFormatIdc],
                 "conf_win_right_offset");
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_conformanceWindow.m_winTopOffset /
                   (int)h264e_sps_to_packet::SubHeightC[(ctx->sps).m_chromaFormatIdc],
                 "conf_win_top_offset");
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_conformanceWindow.m_winBottomOffset /
                   (int)h264e_sps_to_packet::SubHeightC[(ctx->sps).m_chromaFormatIdc],
                 "conf_win_bottom_offset");
    }
    h265e_stream_write_ue_with_log(s,(ctx->sps).m_bitDepthY - 8,"bit_depth_luma_minus8");
    h265e_stream_write_ue_with_log(s,(ctx->sps).m_bitDepthC - 8,"bit_depth_chroma_minus8");
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_bitsForPOC - 4,"log2_max_pic_order_cnt_lsb_minus4");
    h265e_stream_write1_with_log(s,1,"sps_sub_layer_ordering_info_present_flag");
    for (uVar6 = 0; uVar6 <= (ctx->sps).m_maxTLayers - 1; uVar6 = uVar6 + 1) {
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_maxDecPicBuffering[uVar6] - 1,"sps_max_dec_pic_buffering_minus1[i]")
      ;
      h265e_stream_write_ue_with_log(s,(ctx->sps).m_numReorderPics[uVar6],"sps_num_reorder_pics[i]")
      ;
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_maxLatencyIncrease[uVar6],"sps_max_latency_increase_plus1[i]");
    }
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_log2MinCodingBlockSize - 3,"log2_min_coding_block_size_minus3");
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_log2DiffMaxMinCodingBlockSize,"log2_diff_max_min_coding_block_size");
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_quadtreeTULog2MinSize - 2,"log2_min_transform_block_size_minus2");
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_quadtreeTULog2MaxSize - (ctx->sps).m_quadtreeTULog2MinSize,
               "log2_diff_max_min_transform_block_size");
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_quadtreeTUMaxDepthInter - 1,"max_transform_hierarchy_depth_inter");
    h265e_stream_write_ue_with_log
              (s,(ctx->sps).m_quadtreeTUMaxDepthIntra - 1,"max_transform_hierarchy_depth_intra");
    h265e_stream_write1_with_log
              (s,(uint)((ctx->sps).m_scalingListEnabledFlag != 0),"scaling_list_enabled_flag");
    RVar4 = (ctx->sps).m_scalingListEnabledFlag;
    if (RVar4 == 2) {
      _mpp_log_l(2,"h265e_header_gen","m_scalingListEnabledFlag == 2 not supported yet\n",
                 "h265e_sps_write");
    }
    else if (RVar4 == 1) {
      h265e_stream_write1_with_log(s,0,"sps_scaling_list_data_present_flag");
    }
    h265e_stream_write1_with_log(s,(uint)((ctx->sps).m_useAMP != 0),"amp_enabled_flag");
    h265e_stream_write1_with_log
              (s,(uint)((ctx->sps).m_bUseSAO != 0),"sample_adaptive_offset_enabled_flag");
    h265e_stream_write1_with_log(s,(uint)((ctx->sps).m_usePCM != 0),"pcm_enabled_flag");
    if ((ctx->sps).m_usePCM != 0) {
      h265e_stream_write_with_log
                (s,(ctx->sps).m_pcmBitDepthLuma - 1,4,"pcm_sample_bit_depth_luma_minus1");
      h265e_stream_write_with_log
                (s,(ctx->sps).m_pcmBitDepthChroma - 1,4,"pcm_sample_bit_depth_chroma_minus1");
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_pcmLog2MinSize - 3,"log2_min_pcm_luma_coding_block_size_minus3");
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_pcmLog2MaxSize - (ctx->sps).m_pcmLog2MinSize,
                 "log2_diff_max_min_pcm_luma_coding_block_size");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->sps).m_bPCMFilterDisableFlag != 0),"pcm_loop_filter_disable_flag");
    }
    if (((ctx->sps).m_maxTLayers != 0) ||
       (_mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "sps->m_maxTLayers > 0","h265e_sps_write",0x203), (mpp_debug._3_1_ & 0x10) == 0))
    {
      h265e_stream_write_ue_with_log
                (s,(ctx->sps).m_RPSList.m_numberOfReferencePictureSets,"num_short_term_ref_pic_sets"
                );
      for (uVar6 = 0; uVar6 < (uint)(ctx->sps).m_RPSList.m_numberOfReferencePictureSets;
          uVar6 = uVar6 + 1) {
        _mpp_log_l(4,"h265e_header_gen","todo m_numberOfReferencePictureSets",(char *)0x0);
      }
      h265e_stream_write1_with_log
                (s,(uint)((ctx->sps).m_bLongTermRefsPresent != 0),"long_term_ref_pics_present_flag")
      ;
      if ((ctx->sps).m_bLongTermRefsPresent != 0) {
        h265e_stream_write_ue_with_log
                  (s,(ctx->sps).m_numLongTermRefPicSPS,"num_long_term_ref_pic_sps");
        for (uVar5 = 0; uVar5 < (ctx->sps).m_numLongTermRefPicSPS; uVar5 = uVar5 + 1) {
          h265e_stream_write_with_log
                    (s,(ctx->sps).m_ltRefPicPocLsbSps[uVar5],(ctx->sps).m_bitsForPOC,
                     "lt_ref_pic_poc_lsb_sps");
          h265e_stream_write1_with_log
                    (s,(ctx->sps).m_usedByCurrPicLtSPSFlag[uVar5],"used_by_curr_pic_lt_sps_flag");
        }
      }
      h265e_stream_write1_with_log
                (s,(uint)((ctx->sps).m_TMVPFlagsPresent != 0),"sps_temporal_mvp_enable_flag");
      h265e_stream_write1_with_log
                (s,(ctx->sps).m_useStrongIntraSmoothing,"sps_strong_intra_smoothing_enable_flag");
      h265e_stream_write1_with_log
                (s,(ctx->sps).m_vuiParametersPresentFlag,"vui_parameters_present_flag");
      if ((ctx->sps).m_vuiParametersPresentFlag != 0) {
        codeVUI(s,&(ctx->sps).vui);
      }
      h265e_stream_write1_with_log(s,0,"sps_extension_flag");
      h265e_stream_rbsp_trailing(s);
      h265e_stream_flush(s);
      if ((h265e_debug >> 9 & 1) != 0) {
        _mpp_log_l(4,"h265e_header_gen","write pure sps head size: %d bits",(char *)0x0,
                   (ulong)(((out->stream).enc_stream.byte_cnt - RVar1) * 8));
      }
      if ((h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_sps_write");
      }
      h265e_nal_end(out);
      h265e_nal_start(out,0x22,3);
      h265e_set_pps(ctx,&ctx->pps,&ctx->sps);
      h265e_stream_realign(s);
      RVar1 = (out->stream).enc_stream.byte_cnt;
      if ((h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_pps_write");
      }
      h265e_stream_write_ue_with_log(s,(ctx->pps).m_PPSId,"pps_pic_parameter_set_id");
      h265e_stream_write_ue_with_log(s,(ctx->pps).m_SPSId,"pps_seq_parameter_set_id");
      h265e_stream_write1_with_log(s,0,"dependent_slice_segments_enabled_flag");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_outputFlagPresentFlag != 0),"output_flag_present_flag");
      h265e_stream_write_with_log
                (s,(ctx->pps).m_numExtraSliceHeaderBits,3,"num_extra_slice_header_bits");
      h265e_stream_write1_with_log(s,(ctx->pps).m_signHideFlag,"sign_data_hiding_flag");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_cabacInitPresentFlag != 0),"cabac_init_present_flag");
      h265e_stream_write_ue_with_log
                (s,(ctx->pps).m_numRefIdxL0DefaultActive - 1,"num_ref_idx_l0_default_active_minus1")
      ;
      h265e_stream_write_ue_with_log
                (s,(ctx->pps).m_numRefIdxL1DefaultActive - 1,"num_ref_idx_l1_default_active_minus1")
      ;
      h265e_stream_write_se_with_log(s,(ctx->pps).m_picInitQPMinus26,"init_qp_minus26");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_bConstrainedIntraPred != 0),"constrained_intra_pred_flag");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_useTransformSkip != 0),"transform_skip_enabled_flag");
      h265e_stream_write1_with_log(s,(uint)((ctx->pps).m_useDQP != 0),"cu_qp_delta_enabled_flag");
      if ((ctx->pps).m_useDQP != 0) {
        h265e_stream_write_ue_with_log(s,(ctx->pps).m_maxCuDQPDepth,"diff_cu_qp_delta_depth");
      }
      h265e_stream_write_se_with_log(s,(ctx->pps).m_chromaCbQpOffset,"pps_cb_qp_offset");
      h265e_stream_write_se_with_log(s,(ctx->pps).m_chromaCrQpOffset,"pps_cr_qp_offset");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_bSliceChromaQpFlag != 0),
                 "pps_slice_chroma_qp_offsets_present_flag");
      h265e_stream_write1_with_log(s,(uint)((ctx->pps).m_bUseWeightPred != 0),"weighted_pred_flag");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_useWeightedBiPred != 0),"weighted_bipred_flag");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_transquantBypassEnableFlag != 0),
                 "transquant_bypass_enable_flag");
      h265e_stream_write1_with_log(s,(ctx->pps).m_tiles_enabled_flag,"tiles_enabled_flag");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_entropyCodingSyncEnabledFlag != 0),
                 "entropy_coding_sync_enabled_flag");
      if ((ctx->pps).m_tiles_enabled_flag != 0) {
        h265e_stream_write_ue_with_log
                  (s,(ctx->pps).m_nNumTileColumnsMinus1,"num_tile_columns_minus1");
        h265e_stream_write_ue_with_log(s,(ctx->pps).m_nNumTileRowsMinus1,"num_tile_rows_minus1");
        h265e_stream_write1_with_log(s,(ctx->pps).m_bTileUniformSpacing,"uniform_spacing_flag");
        if ((ctx->pps).m_bTileUniformSpacing == 0) {
          for (lVar2 = 0; lVar2 < (ctx->pps).m_nNumTileColumnsMinus1; lVar2 = lVar2 + 1) {
            h265e_stream_write_ue_with_log
                      (s,(ctx->pps).m_nTileColumnWidthArray[lVar2] - 1,"column_width_minus1");
          }
          for (lVar2 = 0; iVar3 = (ctx->pps).m_nNumTileRowsMinus1, lVar2 < iVar3; lVar2 = lVar2 + 1)
          {
            h265e_stream_write_ue_with_log
                      (s,(ctx->pps).m_nTileRowHeightArray[lVar2] - 1,"row_height_minus1");
          }
        }
        else {
          iVar3 = (ctx->pps).m_nNumTileRowsMinus1;
        }
        if ((iVar3 + (ctx->pps).m_nNumTileColumnsMinus1 == 0) &&
           (_mpp_log_l(2,"h265e_header_gen","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "(pps->m_nNumTileColumnsMinus1 + pps->m_nNumTileRowsMinus1) != 0",
                       "h265e_pps_write",0x25e), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_001c6435;
        h265e_stream_write1_with_log
                  (s,(uint)((ctx->pps).m_loopFilterAcrossTilesEnabledFlag != 0),
                   "loop_filter_across_tiles_enabled_flag");
      }
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_LFCrossSliceBoundaryFlag != 0),
                 "loop_filter_across_slices_enabled_flag");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_deblockingFilterControlPresentFlag != 0),
                 "deblocking_filter_control_present_flag");
      if ((ctx->pps).m_deblockingFilterControlPresentFlag != 0) {
        h265e_stream_write1_with_log
                  (s,(uint)((ctx->pps).m_deblockingFilterOverrideEnabledFlag != 0),
                   "deblocking_filter_override_enabled_flag");
        h265e_stream_write1_with_log
                  (s,(uint)((ctx->pps).m_picDisableDeblockingFilterFlag != 0),
                   "pps_disable_deblocking_filter_flag");
        if ((ctx->pps).m_picDisableDeblockingFilterFlag == 0) {
          h265e_stream_write_se_with_log
                    (s,(ctx->pps).m_deblockingFilterBetaOffsetDiv2,"pps_beta_offset_div2");
          h265e_stream_write_se_with_log
                    (s,(ctx->pps).m_deblockingFilterTcOffsetDiv2,"pps_tc_offset_div2");
        }
      }
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_scalingListPresentFlag != 0),
                 "pps_scaling_list_data_present_flag");
      h265e_stream_write1_with_log
                (s,(ctx->pps).m_listsModificationPresentFlag,"lists_modification_present_flag");
      h265e_stream_write_ue_with_log
                (s,(ctx->pps).m_log2ParallelMergeLevelMinus2,"log2_parallel_merge_level_minus2");
      h265e_stream_write1_with_log
                (s,(uint)((ctx->pps).m_sliceHeaderExtensionPresentFlag != 0),
                 "slice_segment_header_extension_present_flag");
      h265e_stream_write1_with_log(s,0,"pps_extension_flag");
      h265e_stream_rbsp_trailing(s);
      h265e_stream_flush(s);
      if ((h265e_debug >> 9 & 1) != 0) {
        _mpp_log_l(4,"h265e_header_gen","write pure pps size: %d bits",(char *)0x0,
                   (ulong)(((out->stream).enc_stream.byte_cnt - RVar1) * 8));
      }
      if ((h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_pps_write");
      }
      h265e_nal_end(out);
      dst = out->nal_buf;
      uVar6 = out->nal_num;
      if ((h265e_debug & 1) != 0) {
        _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_encapsulate_nals");
      }
      lVar2 = 0;
      uVar5 = 0;
      if (0 < (int)uVar6) {
        uVar5 = (ulong)uVar6;
      }
      lVar8 = uVar5 * 0x30;
      iVar3 = 0;
      for (; lVar8 - lVar2 != 0; lVar2 = lVar2 + 0x30) {
        iVar3 = iVar3 + *(int *)((long)&out->nal[0].i_payload + lVar2);
      }
      uVar6 = (iVar3 * 3) / 2 + uVar6 * 4 + 0x44;
      for (lVar2 = 0; lVar8 - lVar2 != 0; lVar2 = lVar2 + 0x30) {
        uVar6 = uVar6 + *(int *)((long)&out->nal[0].i_padding + lVar2);
      }
      for (lVar2 = 0; lVar8 - lVar2 != 0; lVar2 = lVar2 + 0x30) {
        uVar7 = 1;
        if (lVar2 != 0) {
          uVar7 = (uint)(*(int *)((long)&out->nal[0].i_type + lVar2) - 0x20U < 3);
        }
        *(uint *)((long)&out->nal[0].b_long_startcode + lVar2) = uVar7;
        h265e_nal_encode(dst,(H265eNal *)((long)&out->nal[0].i_ref_idc + lVar2));
        dst = dst + *(int *)((long)&out->nal[0].i_payload + lVar2);
      }
      if ((h265e_debug >> 9 & 1) != 0) {
        _mpp_log_l(4,"h265e_header_gen","nals total size: %d bytes, necessary_size %d",(char *)0x0,
                   (long)dst - (long)out->nal_buf,(ulong)uVar6);
      }
      if (((h265e_debug & 1) != 0) &&
         (_mpp_log_l(4,"h265e_header_gen","leave\n","h265e_encapsulate_nals"),
         (h265e_debug & 1) != 0)) {
        _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_set_extra_info");
      }
      return MPP_OK;
    }
  }
LAB_001c6435:
  abort();
}

Assistant:

MPP_RET h265e_set_extra_info(H265eCtx *ctx)
{
    H265eExtraInfo *info = (H265eExtraInfo *)ctx->extra_info;
    H265eSps *sps = &ctx->sps;
    H265ePps *pps = &ctx->pps;
    H265eVps *vps = &ctx->vps;

    h265e_dbg_func("enter\n");
    info->nal_num = 0;
    info->temporal_id = 0;
    h265e_stream_reset(&info->stream);

    h265e_nal_start(info, NAL_VPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_vps(ctx, vps);
    h265e_vps_write(vps, &info->stream);
    h265e_nal_end(info);

    h265e_nal_start(info, NAL_SPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_sps(ctx, sps, vps);
    h265e_sps_write(sps, &info->stream);
    h265e_nal_end(info);

    h265e_nal_start(info, NAL_PPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_pps(ctx, pps, sps);
    h265e_pps_write(pps, sps, &info->stream);
    h265e_nal_end(info);

    h265e_encapsulate_nals(info);

    h265e_dbg_func("leave\n");
    return MPP_OK;
}